

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAig.c
# Opt level: O0

void Gia_ManSeqCleanupClasses(Gia_Man_t *p,int fConst,int fEquiv,int fVerbose)

{
  Aig_Man_t *pAig;
  Aig_Man_t *p_00;
  Aig_Man_t *pTemp;
  Aig_Man_t *pNew;
  int fVerbose_local;
  int fEquiv_local;
  int fConst_local;
  Gia_Man_t *p_local;
  
  pAig = Gia_ManToAigSimple(p);
  p_00 = Aig_ManScl(pAig,fConst,fEquiv,0,-1,-1,fVerbose,0);
  Gia_ManReprFromAigRepr(pAig,p);
  Aig_ManStop(p_00);
  Aig_ManStop(pAig);
  return;
}

Assistant:

void Gia_ManSeqCleanupClasses( Gia_Man_t * p, int fConst, int fEquiv, int fVerbose )
{
    Aig_Man_t * pNew, * pTemp;
    pNew  = Gia_ManToAigSimple( p );
    pTemp = Aig_ManScl( pNew, fConst, fEquiv, 0, -1, -1, fVerbose, 0 );
    Gia_ManReprFromAigRepr( pNew, p );
    Aig_ManStop( pTemp );
    Aig_ManStop( pNew );
}